

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O2

void __thiscall
AVSInterface::AVSInDelegator::AVSInDelegator
          (AVSInDelegator *this,AVSValue *args,vector<Param,_std::allocator<Param>_> *params)

{
  pointer pPVar1;
  mapped_type *pmVar2;
  int iVar3;
  pointer pPVar4;
  allocator<char> local_59;
  AVSValue *local_58;
  key_type local_50;
  
  (this->super_InDelegator)._vptr_InDelegator = (_func_int **)&PTR_Read_00119b80;
  local_58 = &this->_args;
  AVSValue::AVSValue(local_58,args);
  (this->_params_index_map)._M_h._M_buckets = &(this->_params_index_map)._M_h._M_single_bucket;
  (this->_params_index_map)._M_h._M_bucket_count = 1;
  (this->_params_index_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_params_index_map)._M_h._M_element_count = 0;
  (this->_params_index_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_params_index_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_params_index_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pPVar1 = (params->super__Vector_base<Param,_std::allocator<Param>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  iVar3 = 0;
  for (pPVar4 = (params->super__Vector_base<Param,_std::allocator<Param>_>)._M_impl.
                super__Vector_impl_data._M_start; pPVar4 != pPVar1; pPVar4 = pPVar4 + 1) {
    if (pPVar4->AVSEnabled == true) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pPVar4->Name,&local_59)
      ;
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->_params_index_map,&local_50);
      *pmVar2 = iVar3;
      iVar3 = iVar3 + 1;
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

AVSInDelegator(const AVSValue args, std::vector<Param> params) : _args(args)
    {
      int idx = 0;
      for (auto &&param : params)
      {
        if (!param.AVSEnabled) continue;
        _params_index_map[param.Name] = idx++;
      }
    }